

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

SampledSpectrum __thiscall
pbrt::Vertex::Le(Vertex *this,
                vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *infiniteLights,
                Vertex *v,SampledWavelengths *lambda)

{
  anon_union_248_3_83785cfc_for_Vertex_2 *this_00;
  TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
  *pTVar1;
  float fVar2;
  array<float,_4> aVar3;
  Vector3f w;
  bool bVar4;
  LightHandle *light;
  TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
  *this_01;
  undefined1 auVar5 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar12 [56];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar15 [60];
  undefined1 auVar13 [64];
  undefined1 auVar16 [56];
  undefined1 auVar14 [64];
  undefined1 auVar17 [16];
  anon_class_16_2_2793a994 func;
  Point3f PVar18;
  Vector3<float> VVar19;
  SampledSpectrum SVar20;
  SampledSpectrum Le;
  Vector3<float> local_a8;
  SampledSpectrum local_98;
  float local_84;
  Ray local_80;
  undefined1 local_58 [16];
  SampledSpectrum local_40;
  
  auVar12 = in_ZMM0._8_56_;
  bVar4 = IsLight(this);
  if (bVar4) {
    PVar18 = Interaction::p(&(v->field_2).ei.super_Interaction);
    local_84 = PVar18.super_Tuple3<pbrt::Point3,_float>.z;
    auVar8._0_8_ = PVar18.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar8._8_56_ = auVar12;
    this_00 = &this->field_2;
    local_58 = auVar8._0_16_;
    PVar18 = Interaction::p(&(this_00->ei).super_Interaction);
    auVar6._0_8_ = PVar18.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar6._8_56_ = auVar12;
    auVar17 = vsubps_avx(local_58,auVar6._0_16_);
    local_a8.super_Tuple3<pbrt::Vector3,_float>.z =
         local_84 - PVar18.super_Tuple3<pbrt::Point3,_float>.z;
    local_a8.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar17);
    auVar5._0_4_ = auVar17._0_4_ * auVar17._0_4_;
    auVar5._4_4_ = auVar17._4_4_ * auVar17._4_4_;
    auVar5._8_4_ = auVar17._8_4_ * auVar17._8_4_;
    auVar5._12_4_ = auVar17._12_4_ * auVar17._12_4_;
    auVar17 = vhaddps_avx(auVar5,auVar5);
    fVar2 = local_a8.super_Tuple3<pbrt::Vector3,_float>.z *
            local_a8.super_Tuple3<pbrt::Vector3,_float>.z + auVar17._0_4_;
    auVar12 = (undefined1  [56])0x0;
    auVar15 = ZEXT860(SUB128(ZEXT812(0),4));
    if ((fVar2 != 0.0) || (NAN(fVar2))) {
      VVar19 = Normalize<float>(&local_a8);
      auVar13._0_4_ = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar13._4_60_ = auVar15;
      auVar7._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar7._8_56_ = auVar12;
      local_a8.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar7._0_16_);
      local_a8.super_Tuple3<pbrt::Vector3,_float>.z = auVar13._0_4_;
      bVar4 = IsInfiniteLight(this);
      auVar16 = auVar13._8_56_;
      if (bVar4) {
        auVar8 = ZEXT1664(ZEXT816(0) << 0x40);
        SampledSpectrum::SampledSpectrum(&local_98,0.0);
        this_01 = (TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
                   *)(infiniteLights->
                     super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>).
                     _M_impl.super__Vector_impl_data._M_start;
        pTVar1 = (TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
                  *)(infiniteLights->
                    super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
        while( true ) {
          auVar16 = auVar13._8_56_;
          auVar12 = auVar8._8_56_;
          if (this_01 == pTVar1) break;
          PVar18 = Interaction::p(&(this_00->ei).super_Interaction);
          local_80.o.super_Tuple3<pbrt::Point3,_float>.z =
               PVar18.super_Tuple3<pbrt::Point3,_float>.z;
          auVar9._0_8_ = PVar18.super_Tuple3<pbrt::Point3,_float>._0_8_;
          auVar9._8_56_ = auVar12;
          local_80.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar9._0_16_);
          auVar17._0_8_ = local_a8.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
          auVar17._8_4_ = 0x80000000;
          auVar17._12_4_ = 0x80000000;
          local_80.d.super_Tuple3<pbrt::Vector3,_float>.z =
               -local_a8.super_Tuple3<pbrt::Vector3,_float>.z;
          local_80.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar17);
          local_80.time = 0.0;
          local_80.medium.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
          .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                   )0;
          func.lambda = lambda;
          func.ray = &local_80;
          SVar20 = TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
                   ::
                   Dispatch<pbrt::LightHandle::Le(pbrt::Ray_const&,pbrt::SampledWavelengths_const&)const::_lambda(auto:1)_1_>
                             (this_01,func);
          auVar13._0_8_ = SVar20.values.values._8_8_;
          auVar13._8_56_ = auVar16;
          auVar10._0_8_ = SVar20.values.values._0_8_;
          auVar10._8_56_ = auVar12;
          local_40.values.values = (array<float,_4>)vmovlhps_avx(auVar10._0_16_,auVar13._0_16_);
          auVar8 = ZEXT1664((undefined1  [16])local_40.values.values);
          SampledSpectrum::operator+=(&local_98,&local_40);
          this_01 = this_01 + 8;
        }
        return (array<float,_4>)local_98.values.values;
      }
      if (((this->field_2).si.areaLight.
           super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
           .bits & 0xffffffffffff) != 0) {
        PVar18 = Interaction::p(&(this_00->ei).super_Interaction);
        w.super_Tuple3<pbrt::Vector3,_float>.z = local_a8.super_Tuple3<pbrt::Vector3,_float>.z;
        w.super_Tuple3<pbrt::Vector3,_float>.x = local_a8.super_Tuple3<pbrt::Vector3,_float>.x;
        w.super_Tuple3<pbrt::Vector3,_float>.y = local_a8.super_Tuple3<pbrt::Vector3,_float>.y;
        SVar20 = LightHandle::L(&(this->field_2).si.areaLight,PVar18,
                                (Normal3f)
                                *(Tuple3<pbrt::Normal3,_float> *)((long)&this->field_2 + 0x28),
                                (Point2f)(this->field_2).ei.super_Interaction.uv.
                                         super_Tuple2<pbrt::Point2,_float>,w,lambda);
        auVar14._0_8_ = SVar20.values.values._8_8_;
        auVar14._8_56_ = auVar16;
        auVar11._0_8_ = SVar20.values.values._0_8_;
        auVar11._8_56_ = auVar12;
        aVar3.values = (float  [4])vmovlhps_avx(auVar11._0_16_,auVar14._0_16_);
        return (SampledSpectrum)(array<float,_4>)aVar3.values;
      }
    }
  }
  SampledSpectrum::SampledSpectrum(&local_98,0.0);
  return (array<float,_4>)(array<float,_4>)local_98;
}

Assistant:

SampledSpectrum Le(const std::vector<LightHandle> &infiniteLights, const Vertex &v,
                       const SampledWavelengths &lambda) const {
        if (!IsLight())
            return SampledSpectrum(0.f);
        Vector3f w = v.p() - p();
        if (LengthSquared(w) == 0)
            return SampledSpectrum(0.);
        w = Normalize(w);
        if (IsInfiniteLight()) {
            // Return emitted radiance for infinite light sources
            SampledSpectrum Le(0.f);
            for (const auto &light : infiniteLights)
                Le += light.Le(Ray(p(), -w), lambda);
            return Le;

        } else if (si.areaLight)
            return si.areaLight.L(si.p(), si.n, si.uv, w, lambda);
        else
            return SampledSpectrum(0.f);
    }